

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_declare_by_type
          (exr_context_t ctxt,int part_index,char *name,char *type,exr_attribute_t **outattr)

{
  uint in_ESI;
  _internal_exr_context *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  _internal_exr_context *data_ptr;
  int32_t in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar1 = 2;
  }
  else {
    data_ptr = in_RDI;
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      eVar1 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if (in_RDI->mode == '\x01') {
      eVar1 = exr_attr_list_add_by_type
                        ((exr_context_t)pctxt,(exr_attribute_list_t *)part,in_stack_00000008,
                         unaff_retaddr,in_stack_fffffffffffffffc,(uint8_t **)data_ptr,
                         (exr_attribute_t **)type);
      internal_exr_unlock(in_RDI);
    }
    else {
      internal_exr_unlock(in_RDI);
      eVar1 = (*in_RDI->standard_error)(in_RDI,8);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_declare_by_type (
    exr_context_t     ctxt,
    int               part_index,
    const char*       name,
    const char*       type,
    exr_attribute_t** outattr)
{
    exr_result_t rv;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    rv = exr_attr_list_add_by_type (
        ctxt, &(part->attributes), name, type, 0, NULL, outattr);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}